

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O0

void __thiscall
msgpack::v1::zone::finalizer_array::push_expand
          (finalizer_array *this,_func_void_void_ptr *func,void *data)

{
  long lVar1;
  finalizer *pfVar2;
  bad_alloc *this_00;
  finalizer *tmp;
  size_t nnext;
  size_t nused;
  void *data_local;
  _func_void_void_ptr *func_local;
  finalizer_array *this_local;
  
  lVar1 = (long)this->m_end - (long)this->m_array >> 4;
  if (lVar1 == 0) {
    tmp = (finalizer *)0x4;
  }
  else {
    tmp = (finalizer *)(lVar1 << 1);
  }
  pfVar2 = (finalizer *)realloc(this->m_array,(long)tmp << 4);
  if (pfVar2 == (finalizer *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this->m_array = pfVar2;
  this->m_end = pfVar2 + (long)tmp;
  this->m_tail = pfVar2 + lVar1;
  finalizer::finalizer(this->m_tail,func,data);
  this->m_tail = this->m_tail + 1;
  return;
}

Assistant:

void push_expand(void (*func)(void*), void* data) {
            const size_t nused = static_cast<size_t>(m_end - m_array);
            size_t nnext;
            if(nused == 0) {
                nnext = (sizeof(finalizer) < 72/2) ?
                    72 / sizeof(finalizer) : 8;
            } else {
                nnext = nused * 2;
            }
            finalizer* tmp =
                static_cast<finalizer*>(::realloc(m_array, sizeof(finalizer) * nnext));
            if(!tmp) {
                throw std::bad_alloc();
            }
            m_array     = tmp;
            m_end   = tmp + nnext;
            m_tail  = tmp + nused;
            new (m_tail) finalizer(func, data);

            ++m_tail;
        }